

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O0

int __thiscall cmFileLock::LockFile(cmFileLock *this,int cmd,int type)

{
  int iVar1;
  undefined2 local_38;
  undefined2 local_36;
  flock lock;
  int type_local;
  int cmd_local;
  cmFileLock *this_local;
  
  lock.l_type = 0;
  lock.l_whence = 0;
  lock._4_4_ = 0;
  lock.l_start = 0;
  lock.l_len._0_4_ = 0;
  local_38 = (undefined2)type;
  local_36 = 0;
  lock.l_pid = type;
  lock._28_4_ = cmd;
  iVar1 = fcntl(this->File,cmd,&local_38);
  return iVar1;
}

Assistant:

int cmFileLock::LockFile(int cmd, int type) const
{
  struct ::flock lock;
  lock.l_start = 0;
  lock.l_len = 0;                         // lock all bytes
  lock.l_pid = 0;                         // unused (for F_GETLK only)
  lock.l_type = static_cast<short>(type); // exclusive lock
  lock.l_whence = SEEK_SET;
  return ::fcntl(this->File, cmd, &lock);
}